

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string_string_utf16_Test::TestBody(string_string_utf16_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t *right;
  char16_t *right_00;
  AssertHelper local_1d0;
  Message local_1c8;
  int local_1c0 [2];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_4;
  Message local_1a0;
  size_t local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  string empty;
  char16_t empty_data [1];
  Message local_148;
  int local_140 [2];
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_108 [8];
  utf16_buffer to_utf16;
  Message local_d0;
  int local_c8 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  utf32_buffer unicode;
  Message local_68;
  size_t local_60 [3];
  size_t local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  string from_utf16;
  string_string_utf16_Test *this_local;
  
  ST::string::from_utf16
            ((string *)&gtest_ar.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  local_48 = text_size<char,29ul>(&utf8_test_data);
  local_60[0] = ST::string::size((string *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_40,"text_size(utf8_test_data)","from_utf16.size()",&local_48,local_60
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(unicode.m_data + 10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(unicode.m_data + 10),&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(unicode.m_data + 10));
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  ST::string::to_utf32((utf32_buffer *)&gtest_ar_1.message_,(string *)&gtest_ar.message_);
  local_c8[1] = 0;
  right = ST::buffer<char32_t>::data((buffer<char32_t> *)&gtest_ar_1.message_);
  local_c8[0] = T_strcmp<char32_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",right);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c0,"0","T_strcmp(test_data, unicode.data())",local_c8 + 1,local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(to_utf16.m_data + 0xc),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(to_utf16.m_data + 0xc),&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(to_utf16.m_data + 0xc));
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  ST::string::from_utf32
            ((string *)&gtest_ar_2.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  ST::string::to_utf16((utf16_buffer *)local_108,(string *)&gtest_ar_2.message_);
  ST::string::~string((string *)&gtest_ar_2.message_);
  local_140[1] = 0;
  right_00 = ST::buffer<char16_t>::data((buffer<char16_t> *)local_108);
  local_140[0] = T_strcmp<char16_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",right_00);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_138,"0","T_strcmp(utf16_test_data, to_utf16.data())",local_140 + 1,
             local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffeb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffeb0,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  empty.m_buffer.m_data[0xe] = '\0';
  empty.m_buffer.m_data[0xf] = '\0';
  ST::string::from_utf16
            ((string *)&gtest_ar_3.message_,(char16_t *)(empty.m_buffer.m_data + 0xe),
             0xffffffffffffffff,check_validity);
  local_18c = 0;
  local_198 = ST::string::size((string *)&gtest_ar_3.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_188,"0U","empty.size()",&local_18c,&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c0[1] = 0;
  pcVar2 = ST::string::c_str((string *)&gtest_ar_3.message_);
  local_1c0[0] = T_strcmp<char>(pcVar2,"");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b8,"0","T_strcmp(empty.c_str(), \"\")",local_1c0 + 1,local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  ST::string::~string((string *)&gtest_ar_3.message_);
  ST::buffer<char16_t>::~buffer((buffer<char16_t> *)local_108);
  ST::buffer<char32_t>::~buffer((buffer<char32_t> *)&gtest_ar_1.message_);
  ST::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(string, string_utf16)
{
    // From UTF-16 to ST::string
    ST::string from_utf16 = ST::string::from_utf16(utf16_test_data);
    EXPECT_EQ(text_size(utf8_test_data), from_utf16.size());
    ST::utf32_buffer unicode = from_utf16.to_utf32();
    EXPECT_EQ(0, T_strcmp(test_data, unicode.data()));

    // From ST::string to UTF-16
    ST::utf16_buffer to_utf16 = ST::string::from_utf32(test_data).to_utf16();
    EXPECT_EQ(0, T_strcmp(utf16_test_data, to_utf16.data()));

    // Empty string
    const char16_t empty_data[] = { 0 };
    ST::string empty = ST::string::from_utf16(empty_data);
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));
}